

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O0

FT_ULong hash_num_lookup(FT_Hashkey *key)

{
  ulong uVar1;
  FT_ULong res;
  FT_ULong num;
  FT_Hashkey *key_local;
  
  uVar1 = (ulong)key->num;
  return (((uVar1 & 0xff) * 0x1f + (uVar1 >> 8 & 0xff)) * 0x1f + (uVar1 >> 0x10 & 0xff)) * 0x1f +
         (uVar1 >> 0x18 & 0xff);
}

Assistant:

static FT_ULong
  hash_num_lookup( FT_Hashkey*  key )
  {
    FT_ULong  num = (FT_ULong)key->num;
    FT_ULong  res;


    /* Mocklisp hash function. */
    res = num & 0xFF;
    res = ( res << 5 ) - res + ( ( num >>  8 ) & 0xFF );
    res = ( res << 5 ) - res + ( ( num >> 16 ) & 0xFF );
    res = ( res << 5 ) - res + ( ( num >> 24 ) & 0xFF );

    return res;
  }